

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

uc_err reg_write_ppc(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  CPUPPCState *env;
  
  if (regid - 2 < 0x20) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x2a < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x2a) * 0x10 + 0x112c8) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x22 < 8) {
    if (3 < *size) {
      *size = 4;
      *(uint *)((long)_env + (ulong)(regid - 0x22) * 4 + 0x108) = *value & 0xf;
      return UC_ERR_OK;
    }
  }
  else {
    switch(regid) {
    case 0x4a:
      if (3 < *size) {
        *size = 4;
        *(undefined4 *)((long)_env + 0x100) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4b:
      if (3 < *size) {
        *size = 4;
        *(undefined4 *)((long)_env + 0x128) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4c:
      if (3 < *size) {
        *size = 4;
        *(undefined4 *)((long)_env + 0x104) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4d:
      if (3 < *size) {
        *size = 4;
        uVar3 = *(uint *)((long)_env + 0x11708) & *value;
        if (((*(byte *)((long)_env + 0x1171c) & 4) != 0) &&
           (((*(uint *)((long)_env + 0x14c) ^ uVar3) >> 0x11 & 1) != 0)) {
          uVar1 = *_env;
          uVar2 = *(undefined8 *)((long)_env + 8);
          *(undefined8 *)_env = *(undefined8 *)((long)_env + 0x150);
          *(undefined8 *)((long)_env + 8) = *(undefined8 *)((long)_env + 0x158);
          *(undefined8 *)((long)_env + 0x150) = uVar1;
          *(undefined8 *)((long)_env + 0x158) = uVar2;
        }
        uVar5 = uVar3 >> 6 & 1;
        if (uVar5 != ((*(uint *)((long)_env + 0x14c) >> 6 & 1) != 0)) {
          *(uint *)((long)_env + 0x118e0) = uVar5 * -0x100000;
        }
        uVar5 = uVar3 | 0x8030;
        if ((uVar3 >> 0xe & 1) == 0) {
          uVar5 = uVar3;
        }
        if ((*(ulong *)((long)_env + 0x11720) >> 0x2d & 1) == 0) {
          uVar5 = uVar3;
        }
        *(uint *)((long)_env + 0x14c) = uVar5;
        uVar3 = (uint)((uVar5 >> 0xe & 1) == 0);
        uVar4 = uVar5 >> 4 & 2 | uVar3;
        if ((*(byte *)((long)_env + 0x1170c) & 8) == 0) {
          uVar4 = uVar4 ^ 2;
          uVar3 = (uVar3 | uVar5 >> 3 & 2) ^ 2;
        }
        else {
          uVar6 = uVar5 >> 0x1a & 4;
          uVar4 = uVar4 | uVar6;
          uVar3 = uVar6 | uVar5 >> 3 & 2 | uVar3;
        }
        *(uint *)((long)_env + 0x11904) = uVar4;
        *(uint *)((long)_env + 0x11908) = uVar3;
        *(uint *)((long)_env + 0x118fc) = uVar5 & 0x82c06631 | *(uint *)((long)_env + 0x11900);
        return UC_ERR_OK;
      }
      break;
    case 0x4e:
      if (3 < *size) {
        *size = 4;
        store_fpscr((CPUPPCState_conflict *)_env,(ulong)*value,0xffffffff);
        return UC_ERR_OK;
      }
      break;
    case 0x4f:
      if (3 < *size) {
        *size = 4;
        uVar3 = *value;
        for (uVar5 = 7; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
          *(uint *)((long)_env + (ulong)uVar5 * 4 + 0x108) = uVar3 & 0xf;
          uVar3 = uVar3 >> 4;
        }
        return UC_ERR_OK;
      }
      break;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (3 < *size) {
        *size = 4;
        *(undefined4 *)((long)_env + 0x160) = *value;
        *setpc = 1;
        return UC_ERR_OK;
      }
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUPPCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_PPC_REG_0 && regid <= UC_PPC_REG_31) {
        CHECK_REG_TYPE(ppcreg_t);
        env->gpr[regid - UC_PPC_REG_0] = *(ppcreg_t *)value;
    } else if (regid >= UC_PPC_REG_FPR0 && regid <= UC_PPC_REG_FPR31) {
        CHECK_REG_TYPE(uint64_t);
        env->vsr[regid - UC_PPC_REG_FPR0].VsrD(0) = *(uint64_t *)value;
    } else if (regid >= UC_PPC_REG_CR0 && regid <= UC_PPC_REG_CR7) {
        CHECK_REG_TYPE(uint32_t);
        env->crf[regid - UC_PPC_REG_CR0] = (*(uint32_t *)value) & 0b1111;
    } else {
        switch (regid) {
        default:
            break;
        case UC_PPC_REG_PC:
            CHECK_REG_TYPE(ppcreg_t);
            env->nip = *(ppcreg_t *)value;
            *setpc = 1;
            break;
        case UC_PPC_REG_CR: {
            CHECK_REG_TYPE(uint32_t);
            int i;
            uint32_t val = *(uint32_t *)value;
            for (i = 7; i >= 0; i--) {
                env->crf[i] = val & 0b1111;
                val >>= 4;
            }
            break;
        }
        case UC_PPC_REG_LR:
            CHECK_REG_TYPE(ppcreg_t);
            env->lr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_CTR:
            CHECK_REG_TYPE(ppcreg_t);
            env->ctr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_MSR:
            CHECK_REG_TYPE(ppcreg_t);
            uc_ppc_store_msr(env, *(ppcreg_t *)value, 0);
            break;
        case UC_PPC_REG_XER:
            CHECK_REG_TYPE(uint32_t);
            env->xer = *(uint32_t *)value;
            break;
        case UC_PPC_REG_FPSCR:
            CHECK_REG_TYPE(uint32_t);
            store_fpscr(env, *(uint32_t *)value, 0xffffffff);
            break;
        }
    }

    return ret;
}